

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

char * Abc_SopCreateFromTruthIsop(Mem_Flex_t *pMan,int nVars,word *pTruth,Vec_Int_t *vCover)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                  ,0x1cd,"char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)")
    ;
  }
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  for (; (uVar4 = uVar2, uVar2 != uVar3 && (uVar4 = uVar3, pTruth[uVar3] == 0)); uVar3 = uVar3 + 1)
  {
  }
  if ((uint)uVar4 == uVar1) {
    pcVar5 = " 0\n";
  }
  else {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (pTruth[uVar3] != 0xffffffffffffffff) {
        uVar2 = uVar3 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar2 != uVar1) {
      uVar1 = Kit_TruthIsop((uint *)pTruth,nVars,vCover,1);
      if (nVars < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                      ,0x1dd,
                      "char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)");
      }
      if (1 < uVar1) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                      ,0x1de,
                      "char *Abc_SopCreateFromTruthIsop(Mem_Flex_t *, int, word *, Vec_Int_t *)");
      }
      pcVar5 = Abc_SopCreateFromIsop(pMan,nVars,vCover);
      if (uVar1 != 0) {
        Abc_SopComplement(pcVar5);
      }
      return pcVar5;
    }
    pcVar5 = " 1\n";
  }
  pcVar5 = Abc_SopRegister(pMan,pcVar5);
  return pcVar5;
}

Assistant:

char * Abc_SopCreateFromTruthIsop( Mem_Flex_t * pMan, int nVars, word * pTruth, Vec_Int_t * vCover )
{
    char * pSop = NULL;
    int w, nWords  = Abc_Truth6WordNum( nVars );
    assert( nVars < 16 );

    for ( w = 0; w < nWords; w++ )
        if ( pTruth[w] )
            break;
    if ( w == nWords )
        return Abc_SopRegister( pMan, " 0\n" );

    for ( w = 0; w < nWords; w++ )
        if ( ~pTruth[w] )
            break;
    if ( w == nWords )
        return Abc_SopRegister( pMan, " 1\n" );

    {
        int RetValue = Kit_TruthIsop( (unsigned *)pTruth, nVars, vCover, 1 );
        assert( nVars > 0 );
        assert( RetValue == 0 || RetValue == 1 );
        pSop = Abc_SopCreateFromIsop( pMan, nVars, vCover );
        if ( RetValue )
            Abc_SopComplement( pSop );
    }
    return pSop;
}